

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O0

PreparedMessage *
uWS::WebSocket<true>::prepareMessage
          (char *data,size_t length,OpCode opCode,bool compressed,
          _func_void_void_ptr_void_ptr_bool_void_ptr *callback)

{
  PreparedMessage *pPVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 in_DL;
  size_t in_RSI;
  undefined8 in_RDI;
  _func_void_void_ptr_void_ptr_bool_void_ptr *in_R8;
  PreparedMessage *preparedMessage;
  undefined6 in_stack_00000010;
  OpCode opCode_00;
  
  opCode_00 = (OpCode)((ulong)in_RDI >> 0x38);
  pPVar1 = (PreparedMessage *)operator_new(0x20);
  pcVar2 = (char *)operator_new__(in_RSI + 10);
  pPVar1->buffer = pcVar2;
  sVar3 = WebSocketProtocol<true>::formatMessage
                    ((char *)CONCAT17(opCode,CONCAT16(compressed,in_stack_00000010)),
                     (char *)callback,(size_t)preparedMessage,opCode_00,in_RSI,(bool)in_DL);
  pPVar1->length = sVar3;
  pPVar1->references = 1;
  pPVar1->callback = in_R8;
  return pPVar1;
}

Assistant:

typename WebSocket<isServer>::PreparedMessage *WebSocket<isServer>::prepareMessage(char *data, size_t length, OpCode opCode, bool compressed, void(*callback)(void *webSocket, void *data, bool cancelled, void *reserved)) {
    PreparedMessage *preparedMessage = new PreparedMessage;
    preparedMessage->buffer = new char[length + 10];
    preparedMessage->length = WebSocketProtocol<isServer>::formatMessage(preparedMessage->buffer, data, length, opCode, length, compressed);
    preparedMessage->references = 1;
    preparedMessage->callback = callback;
    return preparedMessage;
}